

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

Statement * rsg::anon_unknown_0::create<rsg::ConditionalStatement>(GeneratorState *state)

{
  ConditionalStatement *this;
  GeneratorState *state_local;
  
  this = (ConditionalStatement *)operator_new(0x38);
  ConditionalStatement::ConditionalStatement(this,state);
  return &this->super_Statement;
}

Assistant:

Statement*	create		(GeneratorState& state)			{ return new T(state);			}